

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O1

void __thiscall xray_re::xr_sector_object::save_v12(xr_sector_object *this,xr_ini_writer *w)

{
  pointer psVar1;
  size_t sVar2;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  char *__buf_00;
  uint32_t id;
  pointer item;
  write_ini_item local_31;
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1f21c9,(void *)0xff,in_RCX);
  xr_ini_writer::write(w,0x1f21db,__buf,in_RCX);
  __buf_00 = "on";
  if (this->m_private == '\0') {
    __buf_00 = "off";
  }
  __n = 1;
  xr_ini_writer::write(w,0x1e8ea5,__buf_00,1);
  item = (this->m_items).
         super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>._M_impl.
         super__Vector_impl_data._M_start;
  psVar1 = (this->m_items).
           super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (item != psVar1) {
    sVar2 = 0;
    do {
      __n = sVar2;
      id = (uint32_t)__n;
      write_ini_item::operator()(&local_31,item,w,id);
      item = item + 1;
      sVar2 = (ulong)(id + 1);
    } while (item != psVar1);
  }
  xr_ini_writer::write
            (w,0x1f21e8,
             (void *)((long)(this->m_items).
                            super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_items).
                            super__Vector_base<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6),__n);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sector_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("change_map_to_idx", 255);
	w->write("sector_color", this->m_color);
	w->write("default", this->m_private ? "on" : "off");

	w->w_ini_seq(this->m_items, write_ini_item());
	w->write("items_count", this->m_items.size());
	w->write("version", SECTOR_VERSION_V12);
}